

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightcollection.cpp
# Opt level: O2

Light * newLight(Json *conf)

{
  bool bVar1;
  const_reference pvVar2;
  DirectionalLight *this;
  Image *this_00;
  undefined8 *puVar3;
  vec3f vVar4;
  vec3f vVar5;
  string local_78;
  undefined8 local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  vec3f local_28;
  
  pvVar2 = nlohmann::
           basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
           ::operator[]<char_const>
                     ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                       *)conf,"type");
  bVar1 = nlohmann::operator==<const_char_*,_0>(pvVar2,"point");
  if (bVar1) {
    this = (DirectionalLight *)operator_new(0x28);
    pvVar2 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)conf,"intensity");
    vVar4 = json2vec3f(pvVar2);
    local_58 = vVar4._0_8_;
    pvVar2 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)conf,"position");
    vVar5 = json2vec3f(pvVar2);
    this->field_0x8 = 1;
    *(undefined ***)this = &PTR_sampleIrradiance_00160628;
    (this->irradiance).x = (float)(undefined4)local_58;
    (this->irradiance).y = (float)local_58._4_4_;
    (this->irradiance).z = vVar4.z;
    this->direction = vVar5;
  }
  else {
    pvVar2 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)conf,"type");
    bVar1 = nlohmann::operator==<const_char_*,_0>(pvVar2,"directional");
    if (bVar1) {
      this = (DirectionalLight *)operator_new(0x28);
      pvVar2 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)conf,"irradiance");
      local_78._0_12_ = json2vec3f(pvVar2);
      pvVar2 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)conf,"direction");
      local_28 = json2vec3f(pvVar2);
      DirectionalLight::DirectionalLight(this,(Color *)&local_78,&local_28);
    }
    else {
      pvVar2 = nlohmann::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                           *)conf,"type");
      bVar1 = nlohmann::operator==<const_char_*,_0>(pvVar2,"constant");
      if (bVar1) {
        this = (DirectionalLight *)operator_new(0x18);
        pvVar2 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)conf,"radiance");
        vVar4 = json2vec3f(pvVar2);
        this->field_0x8 = 0;
        *(undefined ***)this = &PTR_sampleIrradiance_001606b0;
        (this->irradiance).x = vVar4.x;
        (this->irradiance).y = vVar4.y;
        (this->irradiance).z = vVar4.z;
      }
      else {
        pvVar2 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)conf,"type");
        bVar1 = nlohmann::operator==<const_char_*,_0>(pvVar2,"envmap");
        if (!bVar1) {
          puVar3 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar3 = "unrecognized type of light source";
          __cxa_throw(puVar3,&char_const*::typeinfo,0);
        }
        this = (DirectionalLight *)operator_new(0x18);
        this_00 = (Image *)operator_new(0x10);
        pvVar2 = nlohmann::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                             *)conf,"radiance");
        nlohmann::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        ::
        get<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  (&local_48,pvVar2);
        getpath(&local_78,&local_48);
        Image::Image(this_00,&local_78);
        this->field_0x8 = 0;
        *(undefined ***)this = &PTR_sampleIrradiance_001606e8;
        *(Image **)&(this->irradiance).y = this_00;
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_48);
      }
    }
  }
  return (Light *)this;
}

Assistant:

Light* newLight(const Json& conf) {
	if (conf["type"] == "point")
		return new PointLight(json2vec3f(conf["intensity"]), json2vec3f(conf["position"]));
	if (conf["type"] == "directional")
		return new DirectionalLight(json2vec3f(conf["irradiance"]), json2vec3f(conf["direction"]));
	if (conf["type"] == "constant")
		return new ConstEnvLight(json2vec3f(conf["radiance"]));
	if (conf["type"] == "envmap")
		return new EnvLight(new Image(getpath(conf["radiance"])));
	throw "unrecognized type of light source";
}